

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

void prsxgen_spec(prscxdef *ctx)

{
  prsndef *ppVar1;
  prsbdef *binctx;
  
  binctx = &prsb_cma_C;
  if ((ctx->prscxtok->tokcxflg & 4) == 0) {
    binctx = &prsb_cma;
  }
  ppVar1 = prsxbin(ctx,binctx);
  ppVar1 = prsfold(ctx,ppVar1);
  prs_check_spec(ctx,ppVar1);
  prsgexp(ctx,ppVar1);
  ctx->prscxnode = ctx->prscxnrst;
  ctx->prscxnrem = ctx->prscxrrst;
  return;
}

Assistant:

void prsxgen_spec(prscxdef *ctx)
{
    prsndef *exprnode;

    /* parse the expression */
    exprnode = prsexpr(ctx);

    /* check for speculative execution problems */
    prs_check_spec(ctx, exprnode);

    /* generate the expression, then reset the parse node pool */
    prsgexp(ctx, exprnode);
    prsrstn(ctx);
}